

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trainer.cc
# Opt level: O1

void __thiscall
xLearn::Trainer::show_train_info
          (Trainer *this,real_t tr_loss,real_t te_loss,real_t te_metric,real_t time_cost,
          bool validate,index_t epoch)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 auVar2 [16];
  ostream *poVar3;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  vector<int,_std::allocator<int>_> width_list;
  Modifier green;
  Modifier reset;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str_list;
  undefined1 local_98 [16];
  int *local_88;
  string local_80;
  Modifier local_5c;
  real_t local_58;
  real_t local_54;
  real_t local_50;
  real_t local_4c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_98._0_12_ = ZEXT812(0);
  local_98._12_4_ = 0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = (int *)0x0;
  local_58 = te_metric;
  local_54 = te_loss;
  local_50 = time_cost;
  local_4c = tr_loss;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = local_98;
  StringPrintf_abi_cxx11_(&local_80,"%d");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             &local_80);
  paVar1 = &local_80.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
  }
  local_80._M_dataplus._M_p._0_4_ = 6;
  if ((int *)local_98._8_8_ == local_88) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_98,(iterator)local_98._8_8_,
               (int *)&local_80);
  }
  else {
    *(int *)local_98._8_8_ = 6;
    local_98._8_8_ = (int *)(local_98._8_8_ + 4);
  }
  StringPrintf_abi_cxx11_(&local_80,"%.6f",(double)local_4c);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             &local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
  }
  local_80._M_dataplus._M_p._0_4_ = 0x14;
  if ((int *)local_98._8_8_ == local_88) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_98,(iterator)local_98._8_8_,
               (int *)&local_80);
  }
  else {
    *(int *)local_98._8_8_ = 0x14;
    local_98._8_8_ = (int *)(local_98._8_8_ + 4);
  }
  if (validate) {
    StringPrintf_abi_cxx11_(&local_80,"%.6f",(double)local_54);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
               &local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) != paVar1) {
      operator_delete((undefined1 *)
                      CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
    }
    local_80._M_dataplus._M_p._0_4_ = 0x14;
    if ((int *)local_98._8_8_ == local_88) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                ((vector<int,_std::allocator<int>_> *)local_98,(iterator)local_98._8_8_,
                 (int *)&local_80);
    }
    else {
      *(int *)local_98._8_8_ = 0x14;
      local_98._8_8_ = (int *)(local_98._8_8_ + 4);
    }
    if (this->metric_ != (Metric *)0x0) {
      StringPrintf_abi_cxx11_(&local_80,"%.6f",(double)local_58);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
                 &local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) != paVar1) {
        operator_delete((undefined1 *)
                        CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
      }
      local_80._M_dataplus._M_p._0_4_ = 0x14;
      if ((int *)local_98._8_8_ == local_88) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  ((vector<int,_std::allocator<int>_> *)local_98,(iterator)local_98._8_8_,
                   (int *)&local_80);
      }
      else {
        *(int *)local_98._8_8_ = 0x14;
        local_98._8_8_ = (int *)(local_98._8_8_ + 4);
      }
    }
  }
  StringPrintf_abi_cxx11_(&local_80,"%.2f",(double)local_50);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,
             &local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_) != paVar1) {
    operator_delete((undefined1 *)
                    CONCAT44(local_80._M_dataplus._M_p._4_4_,local_80._M_dataplus._M_p._0_4_));
  }
  local_80._M_dataplus._M_p._0_4_ = 0x14;
  if ((int *)local_98._8_8_ == local_88) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              ((vector<int,_std::allocator<int>_> *)local_98,(iterator)local_98._8_8_,
               (int *)&local_80);
  }
  else {
    *(int *)local_98._8_8_ = 0x14;
    local_98._8_8_ = (int *)(local_98._8_8_ + 4);
  }
  local_80._M_dataplus._M_p._0_4_ = 0x20;
  local_5c.code = RESET;
  poVar3 = Color::operator<<((ostream *)&std::cout,(Modifier *)&local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[ ",2);
  Color::operator<<(poVar3,&local_5c);
  *(undefined8 *)(operator_delete__ + *(long *)(std::cout + -0x18)) = 4;
  auVar2._8_8_ = in_XMM4_Qb;
  auVar2._0_8_ = in_XMM4_Qa;
  auVar2 = vcvtusi2sd_avx512f(auVar2,epoch);
  poVar3 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,(int)((auVar2._0_8_ / (double)this->epoch_) * 100.0));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"%",1);
  poVar3 = Color::operator<<(poVar3,(Modifier *)&local_80);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"      ]",7);
  Color::operator<<(poVar3,&local_5c);
  Color::print_row<std::__cxx11::string>(&local_48,(vector<int,_std::allocator<int>_> *)local_98);
  if ((pointer)local_98._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_98._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void Trainer::show_train_info(real_t tr_loss, 
                              real_t te_loss,
                              real_t te_metric,
                              real_t time_cost, 
                              bool validate,
                              index_t epoch) {
  std::vector<std::string> str_list;
  std::vector<int> width_list;
  str_list.push_back(StringPrintf("%d", epoch));
  width_list.push_back(6);
  str_list.push_back(StringPrintf("%.6f", tr_loss));
  width_list.push_back(20);
  if (validate) {
    str_list.push_back(StringPrintf("%.6f", te_loss));
    width_list.push_back(20);
    if (metric_ != nullptr) {
      str_list.push_back(StringPrintf("%.6f", te_metric));
      width_list.push_back(20);
    }
  }
  str_list.push_back(StringPrintf("%.2f", time_cost));
  width_list.push_back(20);
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier reset(Color::RESET);
  std::cout << green << "[ " << reset;
  std::cout.width(4); 
  std::cout << static_cast<int>(epoch*1.0/epoch_*100) 
            << "%" << green << "      ]"  << reset;
  Color::print_row(str_list, width_list);
}